

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_channel_map_find_channel_position
                    (ma_uint32 channels,ma_channel *pChannelMap,ma_channel channelPosition,
                    ma_uint32 *pChannelIndex)

{
  ma_channel mVar1;
  ma_uint32 channelIndex;
  
  if (pChannelIndex != (ma_uint32 *)0x0) {
    *pChannelIndex = 0xffffffff;
  }
  channelIndex = 0;
  while( true ) {
    if (channels == channelIndex) {
      return 0;
    }
    mVar1 = ma_channel_map_get_channel(pChannelMap,channels,channelIndex);
    if (mVar1 == channelPosition) break;
    channelIndex = channelIndex + 1;
  }
  if (pChannelIndex == (ma_uint32 *)0x0) {
    return 1;
  }
  *pChannelIndex = channelIndex;
  return 1;
}

Assistant:

MA_API ma_bool32 ma_channel_map_find_channel_position(ma_uint32 channels, const ma_channel* pChannelMap, ma_channel channelPosition, ma_uint32* pChannelIndex)
{
    ma_uint32 iChannel;

    if (pChannelIndex != NULL) {
        *pChannelIndex = (ma_uint32)-1;
    }

    for (iChannel = 0; iChannel < channels; ++iChannel) {
        if (ma_channel_map_get_channel(pChannelMap, channels, iChannel) == channelPosition) {
            if (pChannelIndex != NULL) {
                *pChannelIndex = iChannel;
            }

            return MA_TRUE;
        }
    }

    /* Getting here means the channel position was not found. */
    return MA_FALSE;
}